

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O0

void Rml::MeshUtilities::GenerateQuad
               (Mesh *mesh,Vector2f origin,Vector2f dimensions,ColourbPremultiplied colour,
               Vector2f top_left_texcoord,Vector2f bottom_right_texcoord)

{
  Mesh *this;
  size_type sVar1;
  Vector<int> *this_00;
  Vector2<float> local_80;
  Vector2<float> local_78;
  Vector2f local_70;
  Vector2<float> local_68;
  Vector2<float> local_60;
  Vector2<float> local_58;
  int *local_50;
  int *indices;
  Vertex *vertices;
  int i0;
  int v0;
  Mesh *mesh_local;
  float fStack_28;
  Vector2f bottom_right_texcoord_local;
  Vector2f top_left_texcoord_local;
  ColourbPremultiplied colour_local;
  Vector2f dimensions_local;
  Vector2f origin_local;
  
  _i0 = mesh;
  unique0x100002f5 = bottom_right_texcoord;
  bottom_right_texcoord_local = top_left_texcoord;
  dimensions_local = origin;
  sVar1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(&mesh->vertices);
  vertices._4_4_ = (int)sVar1;
  sVar1 = ::std::vector<int,_std::allocator<int>_>::size(&_i0->indices);
  this = _i0;
  vertices._0_4_ = (int)sVar1;
  sVar1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(&_i0->vertices);
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize(&this->vertices,sVar1 + 4);
  this_00 = &_i0->indices;
  sVar1 = ::std::vector<int,_std::allocator<int>_>::size(this_00);
  ::std::vector<int,_std::allocator<int>_>::resize(this_00,sVar1 + 6);
  indices = (int *)::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::data(&_i0->vertices);
  local_50 = ::std::vector<int,_std::allocator<int>_>::data(&_i0->indices);
  *(Vector2f *)(indices + (long)vertices._4_4_ * 5) = dimensions_local;
  *(ColourbPremultiplied *)(indices + (long)vertices._4_4_ * 5 + 2) = colour;
  *(Vector2f *)(indices + (long)vertices._4_4_ * 5 + 3) = bottom_right_texcoord_local;
  top_left_texcoord_local.y = dimensions.x;
  Vector2<float>::Vector2
            (&local_58,dimensions_local.x + top_left_texcoord_local.y,dimensions_local.y);
  *(Vector2<float> *)(indices + (long)(vertices._4_4_ + 1) * 5) = local_58;
  *(ColourbPremultiplied *)(indices + (long)(vertices._4_4_ + 1) * 5 + 2) = colour;
  Vector2<float>::Vector2(&local_60,mesh_local._4_4_,bottom_right_texcoord_local.y);
  *(Vector2<float> *)(indices + (long)(vertices._4_4_ + 1) * 5 + 3) = local_60;
  local_70 = dimensions;
  local_68 = Vector2<float>::operator+(&dimensions_local,dimensions);
  *(Vector2<float> *)(indices + (long)(vertices._4_4_ + 2) * 5) = local_68;
  *(ColourbPremultiplied *)(indices + (long)(vertices._4_4_ + 2) * 5 + 2) = colour;
  *(Vector2f *)(indices + (long)(vertices._4_4_ + 2) * 5 + 3) = stack0xffffffffffffffd4;
  colour_local = (ColourbPremultiplied)dimensions.y;
  Vector2<float>::Vector2(&local_78,dimensions_local.x,dimensions_local.y + (float)colour_local);
  *(Vector2<float> *)(indices + (long)(vertices._4_4_ + 3) * 5) = local_78;
  *(ColourbPremultiplied *)(indices + (long)(vertices._4_4_ + 3) * 5 + 2) = colour;
  Vector2<float>::Vector2(&local_80,bottom_right_texcoord_local.x,fStack_28);
  *(Vector2<float> *)(indices + (long)(vertices._4_4_ + 3) * 5 + 3) = local_80;
  local_50[(int)vertices] = vertices._4_4_;
  local_50[(int)vertices + 1] = vertices._4_4_ + 3;
  local_50[(int)vertices + 2] = vertices._4_4_ + 1;
  local_50[(int)vertices + 3] = vertices._4_4_ + 1;
  local_50[(int)vertices + 4] = vertices._4_4_ + 3;
  local_50[(int)vertices + 5] = vertices._4_4_ + 2;
  return;
}

Assistant:

void MeshUtilities::GenerateQuad(Mesh& mesh, Vector2f origin, Vector2f dimensions, ColourbPremultiplied colour, Vector2f top_left_texcoord,
	Vector2f bottom_right_texcoord)
{
	const int v0 = (int)mesh.vertices.size();
	const int i0 = (int)mesh.indices.size();

	mesh.vertices.resize(mesh.vertices.size() + 4);
	mesh.indices.resize(mesh.indices.size() + 6);
	Vertex* vertices = mesh.vertices.data();
	int* indices = mesh.indices.data();

	vertices[v0 + 0].position = origin;
	vertices[v0 + 0].colour = colour;
	vertices[v0 + 0].tex_coord = top_left_texcoord;

	vertices[v0 + 1].position = Vector2f(origin.x + dimensions.x, origin.y);
	vertices[v0 + 1].colour = colour;
	vertices[v0 + 1].tex_coord = Vector2f(bottom_right_texcoord.x, top_left_texcoord.y);

	vertices[v0 + 2].position = origin + dimensions;
	vertices[v0 + 2].colour = colour;
	vertices[v0 + 2].tex_coord = bottom_right_texcoord;

	vertices[v0 + 3].position = Vector2f(origin.x, origin.y + dimensions.y);
	vertices[v0 + 3].colour = colour;
	vertices[v0 + 3].tex_coord = Vector2f(top_left_texcoord.x, bottom_right_texcoord.y);

	indices[i0 + 0] = v0 + 0;
	indices[i0 + 1] = v0 + 3;
	indices[i0 + 2] = v0 + 1;

	indices[i0 + 3] = v0 + 1;
	indices[i0 + 4] = v0 + 3;
	indices[i0 + 5] = v0 + 2;
}